

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix.h
# Opt level: O2

SuffixImpl * __thiscall
mp::BasicSuffixSet<std::allocator<char>_>::DoAdd
          (BasicSuffixSet<std::allocator<char>_> *this,StringRef name,int kind,int num_values,
          SuffixTable *table)

{
  _Rb_tree_iterator<mp::internal::SuffixBase::Impl> _Var1;
  char *__s;
  _Base_ptr p_Var2;
  Error *this_00;
  size_t __n;
  pair<std::_Rb_tree_iterator<mp::internal::SuffixBase::Impl>,_bool> pVar3;
  StringRef name_local;
  SuffixTable local_90;
  undefined1 local_70 [64];
  
  __n = name.size_;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  name_local.data_ = name.data_;
  name_local.size_ = __n;
  internal::SuffixBase::Impl::Impl((Impl *)local_70,name,kind,0,&local_90);
  pVar3 = std::
          _Rb_tree<mp::internal::SuffixBase::Impl,_mp::internal::SuffixBase::Impl,_std::_Identity<mp::internal::SuffixBase::Impl>,_mp::BasicSuffixSet<std::allocator<char>_>::SuffixNameLess,_std::allocator<mp::internal::SuffixBase::Impl>_>
          ::_M_insert_unique<mp::internal::SuffixBase::Impl>(&(this->set_)._M_t,(Impl *)local_70);
  _Var1 = pVar3.first._M_node;
  std::__cxx11::string::~string((string *)(local_70 + 0x20));
  std::__cxx11::string::~string((string *)&local_90);
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    *(undefined8 *)(_Var1._M_node + 1) = 0;
    _Var1._M_node[1]._M_parent = (_Base_ptr)0x0;
    __s = Allocate<char>(this,__n + 1);
    if (__n != 0) {
      memmove(__s,name.data_,__n);
    }
    __s[__n] = '\0';
    p_Var2 = (_Base_ptr)strlen(__s);
    *(char **)(_Var1._M_node + 1) = __s;
    _Var1._M_node[1]._M_parent = p_Var2;
    *(int *)((long)&_Var1._M_node[1]._M_left + 4) = num_values;
    std::__cxx11::string::_M_assign((string *)(_Var1._M_node + 2));
    return (SuffixImpl *)(_Var1._M_node + 1);
  }
  this_00 = (Error *)__cxa_allocate_exception(0x18);
  Error::Error<fmt::BasicStringRef<char>>(this_00,(CStringRef)0x15a3df,&name_local);
  __cxa_throw(this_00,&Error::typeinfo,fmt::SystemError::~SystemError);
}

Assistant:

typename BasicSuffixSet<Alloc>::SuffixImpl *BasicSuffixSet<Alloc>::DoAdd(
    fmt::StringRef name, int kind, int num_values,
    const SuffixTable& table) {
  std::pair<typename Set::iterator, bool> result =
      set_.insert(Suffix::Impl(name, kind));
  if (!result.second)
    throw Error("duplicate suffix '{}'", name);
  Suffix::Impl *impl = const_cast<SuffixImpl*>(&*result.first);
  /// Set name to empty string so that it is not deleted if new throws.
  std::size_t size = name.size();
  impl->name = fmt::StringRef(0, 0);
  char *name_copy = Allocate<char>(size + 1);
  const char *s = name.data();
  std::copy(s, s + size, fmt::internal::make_ptr(name_copy, size));
  name_copy[size] = 0;
  impl->name = name_copy;
  impl->num_values = num_values;
  impl->table = table;
  return impl;
}